

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# makeTiled.cpp
# Opt level: O0

void anon_unknown.dwarf_181bf::reduceX<unsigned_int>
               (TypedImageChannel<unsigned_int> *channel0,TypedImageChannel<unsigned_int> *channel1,
               bool filter,Extrapolation *ext,bool odd)

{
  int iVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  Image *pIVar5;
  uint *puVar6;
  TypedImageChannel<unsigned_int> *in_RCX;
  byte in_DL;
  ImageChannel *in_RSI;
  ImageChannel *in_RDI;
  undefined1 in_R8B;
  int x_1;
  int y_1;
  int offset;
  int x;
  int y;
  double f;
  int h1;
  int w1;
  int w0;
  int in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 local_58;
  undefined4 local_4c;
  undefined4 local_48;
  undefined4 local_40;
  undefined4 local_3c;
  undefined3 in_stack_ffffffffffffffdc;
  uint w;
  
  w = CONCAT13(in_R8B,in_stack_ffffffffffffffdc) & 0x1ffffff;
  pIVar5 = ImageChannel::image(in_RDI);
  iVar1 = Image::width(pIVar5);
  pIVar5 = ImageChannel::image(in_RSI);
  iVar2 = Image::width(pIVar5);
  pIVar5 = ImageChannel::image(in_RSI);
  iVar3 = Image::height(pIVar5);
  if ((in_DL & 1) == 0) {
    if ((w & 0x1000000) == 0) {
      iVar1 = 0;
    }
    else {
      iVar1 = iVar1 + -1 + (iVar2 + -1) * -2;
    }
    for (local_48 = 0; local_48 < iVar3; local_48 = local_48 + 1) {
      for (local_4c = 0; local_4c < iVar2; local_4c = local_4c + 1) {
        puVar6 = TypedImageChannel<unsigned_int>::operator()
                           ((TypedImageChannel<unsigned_int> *)
                            CONCAT44(in_stack_ffffffffffffffa4,iVar1),in_stack_ffffffffffffff9c,
                            in_stack_ffffffffffffff98);
        in_stack_ffffffffffffff9c = *puVar6;
        puVar6 = TypedImageChannel<unsigned_int>::operator()
                           ((TypedImageChannel<unsigned_int> *)
                            CONCAT44(in_stack_ffffffffffffffa4,iVar1),in_stack_ffffffffffffff9c,
                            in_stack_ffffffffffffff98);
        *puVar6 = in_stack_ffffffffffffff9c;
      }
    }
  }
  else {
    if (iVar2 < 2) {
      local_58 = 1.0;
    }
    else {
      local_58 = (double)(iVar1 + -2) / (double)(iVar2 + -1);
    }
    for (local_3c = 0; local_3c < iVar3; local_3c = local_3c + 1) {
      for (local_40 = 0; local_40 < iVar2; local_40 = local_40 + 1) {
        uVar4 = filterX<unsigned_int>
                          (in_RCX,w,(double)CONCAT44(iVar2,iVar3),(int)((ulong)local_58 >> 0x20),
                           SUB84(local_58,0));
        puVar6 = TypedImageChannel<unsigned_int>::operator()
                           ((TypedImageChannel<unsigned_int> *)
                            CONCAT44(uVar4,in_stack_ffffffffffffffa0),in_stack_ffffffffffffff9c,
                            in_stack_ffffffffffffff98);
        *puVar6 = uVar4;
      }
    }
  }
  return;
}

Assistant:

void
reduceX (
    const TypedImageChannel<T>& channel0,
    TypedImageChannel<T>&       channel1,
    bool                        filter,
    Extrapolation&              ext,
    bool                        odd)
{
    //
    // Shrink an image channel, channel0, horizontally
    // by a factor of 2, and store the result in channel1.
    //

    int w0 = channel0.image ().width ();
    int w1 = channel1.image ().width ();
    int h1 = channel1.image ().height ();

    if (filter)
    {
        //
        // Low-pass filter and resample.
        // For pixels (0, y) and (w1 - 1, y) in channel 1,
        // the low-pass filter in channel0 is centered on
        // pixels (0.5, y) and (w0 - 1.5, y) respectively.
        //

        double f = (w1 > 1) ? double (w0 - 2) / (w1 - 1) : 1;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = filterX (channel0, w0, x * f, y, ext);
    }
    else
    {
        //
        // Resample, skipping every other pixel, without
        // low-pass filtering.  In order to keep the image
        // from sliding to the right if the channel is
        // resampled repeatedly, we skip the rightmost
        // pixel of every row on even passes, and the
        // leftmost pixel on odd passes.
        //

        int offset = odd ? ((w0 - 1) - 2 * (w1 - 1)) : 0;

        for (int y = 0; y < h1; ++y)
            for (int x = 0; x < w1; ++x)
                channel1 (x, y) = channel0 (2 * x + offset, y);
    }
}